

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle_test.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  int i;
  ulong uVar3;
  shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>_>
  planner;
  Ptr env_ptr;
  Ptr goal_state;
  Ptr start_state;
  int num_inad;
  int puzzle_anchor;
  int puzzle_size;
  double del_mha_eps;
  double mha_eps;
  double del_eps;
  double eps;
  double time_limit;
  AnytimePlannerStats<sliding_puzzle::SlidingPuzzleState> anytime_stats;
  
  puzzle_size = 5;
  std::make_shared<sliding_puzzle::SlidingPuzzle,int&,int&>((int *)&env_ptr,&puzzle_size);
  time_limit = 10.0;
  eps = 10.0;
  del_eps = 1.0;
  mha_eps = 10.0;
  del_mha_eps = 1.0;
  planner.
  super___shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  planner.
  super___shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  make_shared<csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,sliding_puzzle::SlidingPuzzleState,double>,std::shared_ptr<sliding_puzzle::SlidingPuzzle>&,double&,double&,double&,double&,double&,int&>
            ((shared_ptr<sliding_puzzle::SlidingPuzzle> *)&anytime_stats,(double *)&env_ptr,
             &time_limit,&eps,&mha_eps,&del_eps,(int *)&del_mha_eps);
  std::
  __shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,sliding_puzzle::SlidingPuzzleState,double>,(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,sliding_puzzle::SlidingPuzzleState,double>,(__gnu_cxx::_Lock_policy)2>
               *)&planner,
              (__shared_ptr<csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
               *)&anytime_stats);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &anytime_stats.solution_paths_.
              super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  sliding_puzzle::SlidingPuzzle::getStartState((SlidingPuzzle *)&start_state);
  sliding_puzzle::SlidingPuzzle::getGoalState((SlidingPuzzle *)&goal_state);
  iVar1 = (**(planner.
              super___shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_vptr_Dijkstra)
                    (planner.
                     super___shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&start_state,&goal_state);
  if ((char)iVar1 == '\0') {
    poVar2 = std::operator<<((ostream *)&std::cout,"Plannar did not return any solution. Error!");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    (*(planner.
       super___shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr)->_vptr_Dijkstra[2])(&anytime_stats);
    poVar2 = std::operator<<((ostream *)&std::cout,"The num solutions found are: ");
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    for (uVar3 = 0;
        uVar3 < (ulong)(((long)anytime_stats.solution_paths_.
                               super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)anytime_stats.solution_paths_.
                              super__Vector_base<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>,_std::allocator<std::vector<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>,_std::allocator<std::shared_ptr<sliding_puzzle::SlidingPuzzleState>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x18); uVar3 = uVar3 + 1)
    {
      poVar2 = std::operator<<((ostream *)&std::cout,"Path lengths are: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2," with epsilon: ");
      poVar2 = std::ostream::_M_insert<double>
                         (anytime_stats.solution_eps_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar3]);
      std::operator<<(poVar2," and planning time is: ");
      poVar2 = std::ostream::_M_insert<double>
                         (anytime_stats.solution_time_.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar3]);
      std::operator<<(poVar2," and hash time is: ");
      poVar2 = std::ostream::_M_insert<double>(sliding_puzzle::hash_time);
      poVar2 = std::operator<<(poVar2," and num expansions is: ");
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar2,
                          anytime_stats.num_expansions_.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar3]);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    csbpl_planner::AnytimePlannerStats<sliding_puzzle::SlidingPuzzleState>::~AnytimePlannerStats
              (&anytime_stats);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&goal_state.
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&start_state.
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&planner.
              super___shared_ptr<csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,_sliding_puzzle::SlidingPuzzleState,_double>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&env_ptr.super___shared_ptr<sliding_puzzle::SlidingPuzzle,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return 0;
}

Assistant:

int main()
{
  typedef csbpl_planner::Dijkstra<sliding_puzzle::SlidingPuzzle,
                                  sliding_puzzle::SlidingPuzzleState,
                                  double> DijkstraType;
  typedef csbpl_planner::AMHAStar<sliding_puzzle::SlidingPuzzle,
                                  sliding_puzzle::SlidingPuzzleState,
                                  double> AMHAStarType;

  int puzzle_size = 5;
  int puzzle_anchor = 0;
  sliding_puzzle::SlidingPuzzle::Ptr env_ptr =
    std::make_shared<sliding_puzzle::SlidingPuzzle>(puzzle_size,
                                                    puzzle_anchor);

  double time_limit = 10;
  double eps = 10;
  double del_eps = 1;
  
  double mha_eps = 10;
  double del_mha_eps = 1;
  
  int num_inad = 4;

  std::shared_ptr<DijkstraType> planner;
  planner = std::make_shared<AMHAStarType>(env_ptr,
                                           time_limit,
                                           eps,
                                           mha_eps,
                                           del_eps,
                                           del_mha_eps,
                                           num_inad);

  sliding_puzzle::SlidingPuzzleState::Ptr start_state = env_ptr->getStartState();
  sliding_puzzle::SlidingPuzzleState::Ptr goal_state = env_ptr->getGoalState();

  
  if (!planner->run(start_state, goal_state))
  {
    std::cout << "Plannar did not return any solution. Error!" << std::endl;
    return 0;
  }

  csbpl_planner::AnytimePlannerStats<sliding_puzzle::SlidingPuzzleState>
    anytime_stats = planner->getAnytimePlannerStats();
  std::cout << "The num solutions found are: "
            << anytime_stats.solution_paths_.size() << std::endl;
  
  for (int i=0; i<anytime_stats.solution_paths_.size(); ++i)
  {
    std::cout << "Path lengths are: " << anytime_stats.solution_paths_[i].size()
              << " with epsilon: " << anytime_stats.solution_eps_[i]
              << " and planning time is: " << anytime_stats.solution_time_[i]
              << " and hash time is: " << sliding_puzzle::hash_time
              << " and num expansions is: " << anytime_stats.num_expansions_[i] << std::endl;
  }

  return 0;
}